

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall kernel::Context::Context(Context *this)

{
  long lVar1;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 *in_stack_00000010;
  once_flag *in_stack_00000018;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::call_once<kernel::Context::Context()::__0>(in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Context::Context()
{
    static std::once_flag globals_initialized{};
    std::call_once(globals_initialized, []() {
        std::string sha256_algo = SHA256AutoDetect();
        LogInfo("Using the '%s' SHA256 implementation\n", sha256_algo);
        RandomInit();
    });
}